

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O0

void __thiscall wasm::DataFlowOpts::doWalkFunction(DataFlowOpts *this,Function *func)

{
  Node *node_00;
  __node_base_ptr funcInit;
  bool bVar1;
  Module *moduleInit;
  vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
  *this_00;
  reference ppNVar2;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *this_01;
  reference ppLVar3;
  mapped_type *ppNVar4;
  pair<std::__detail::_Node_iterator<wasm::DataFlow::Node_*,_true,_false>,_bool> pVar5;
  _Node_iterator_base<wasm::DataFlow::Node_*,_false> local_f0;
  _Node_iterator_base<wasm::DataFlow::Node_*,_false> local_e8;
  iterator iter_1;
  Node *node_2;
  LocalSet *set;
  iterator __end2_1;
  iterator __begin2_1;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *__range2_1;
  Node *node_1;
  iterator iter;
  pointer local_78;
  reference local_70;
  unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_> *node;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
  *__range2;
  unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
  optimized;
  Function *func_local;
  DataFlowOpts *this_local;
  
  optimized._M_h._M_single_bucket = (__node_base_ptr)func;
  Flat::verifyFlatness(func);
  funcInit = optimized._M_h._M_single_bucket;
  moduleInit = Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>::getModule
                         (&(this->
                           super_WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>
                           ).
                           super_PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>
                           .
                           super_Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>
                         );
  DataFlow::Graph::build(&this->graph,(Function *)funcInit,moduleInit);
  DataFlow::Users::build(&this->nodeUsers,&this->graph);
  std::
  unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
  ::unordered_set((unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
                   *)&__range2);
  this_00 = &(this->graph).nodes;
  __end2 = std::
           vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
           ::begin(this_00);
  node = (unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_> *)
         std::
         vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
         ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_*,_std::vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>_>
                                     *)&node), bVar1) {
    local_70 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_*,_std::vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>_>
               ::operator*(&__end2);
    local_78 = std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>::
               get(local_70);
    pVar5 = std::
            unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
            ::insert(&this->workLeft,&local_78);
    iter.super__Node_iterator_base<wasm::DataFlow::Node_*,_false>._M_cur =
         (_Node_iterator_base<wasm::DataFlow::Node_*,_false>)
         pVar5.first.super__Node_iterator_base<wasm::DataFlow::Node_*,_false>._M_cur;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_*,_std::vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>_>
    ::operator++(&__end2);
  }
  while (bVar1 = std::
                 unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
                 ::empty(&this->workLeft), ((bVar1 ^ 0xffU) & 1) != 0) {
    node_1 = (Node *)std::
                     unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
                     ::begin(&this->workLeft);
    ppNVar2 = std::__detail::_Node_iterator<wasm::DataFlow::Node_*,_true,_false>::operator*
                        ((_Node_iterator<wasm::DataFlow::Node_*,_true,_false> *)&node_1);
    node_00 = *ppNVar2;
    std::
    unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
    ::erase(&this->workLeft,(iterator)node_1);
    workOn(this,node_00);
  }
  this_01 = &(this->graph).sets;
  __end2_1 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::begin(this_01);
  set = (LocalSet *)std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::end(this_01);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                        *)&set);
    if (!bVar1) {
      std::
      unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
      ::~unordered_set((unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
                        *)&__range2);
      return;
    }
    ppLVar3 = __gnu_cxx::
              __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
              ::operator*(&__end2_1);
    node_2 = (Node *)*ppLVar3;
    ppNVar4 = std::
              unordered_map<wasm::LocalSet_*,_wasm::DataFlow::Node_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_wasm::DataFlow::Node_*>_>_>
              ::operator[](&(this->graph).setNodeMap,(key_type *)&node_2);
    iter_1.super__Node_iterator_base<wasm::DataFlow::Node_*,_false>._M_cur =
         (_Node_iterator_base<wasm::DataFlow::Node_*,_false>)*ppNVar4;
    local_e8._M_cur =
         (__node_type *)
         std::
         unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
         ::find((unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
                 *)&__range2,(key_type *)&iter_1);
    local_f0._M_cur =
         (__node_type *)
         std::
         unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
         ::end((unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
                *)&__range2);
    bVar1 = std::__detail::operator!=(&local_e8,&local_f0);
    if (bVar1) {
      bVar1 = DataFlow::Node::isExpr
                        ((Node *)iter_1.super__Node_iterator_base<wasm::DataFlow::Node_*,_false>.
                                 _M_cur);
      if (!bVar1) {
        __assert_fail("node->isExpr()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DataFlowOpts.cpp"
                      ,0x4f,"void wasm::DataFlowOpts::doWalkFunction(Function *)");
      }
      (node_2->values).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           *(pointer *)
            ((long)iter_1.super__Node_iterator_base<wasm::DataFlow::Node_*,_false>._M_cur + 8);
    }
    __gnu_cxx::
    __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
    ::operator++(&__end2_1);
  } while( true );
}

Assistant:

void doWalkFunction(Function* func) {
    Flat::verifyFlatness(func);
    // Build the data-flow IR.
    graph.build(func, getModule());
    nodeUsers.build(graph);
    // Propagate optimizations through the graph.
    std::unordered_set<DataFlow::Node*> optimized; // which nodes we optimized
    for (auto& node : graph.nodes) {
      workLeft.insert(node.get()); // we should try to optimize each node
    }
    while (!workLeft.empty()) {
      // std::cout << "\n\ndump before work iter\n";
      // dump(graph, std::cout);
      auto iter = workLeft.begin();
      auto* node = *iter;
      workLeft.erase(iter);
      workOn(node);
    }
    // After updating the DataFlow IR, we can update the sets in
    // the wasm.
    // TODO: we also need phis, as a phi can flow directly into say
    //       a return or a call parameter.
    for (auto* set : graph.sets) {
      auto* node = graph.setNodeMap[set];
      auto iter = optimized.find(node);
      if (iter != optimized.end()) {
        assert(node->isExpr()); // this is a set, where the node is defined
        set->value = node->expr;
      }
    }
  }